

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::do_calc_end(aalcalc *this,int period_no)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  reference pvVar7;
  mapped_type *this_00;
  reference pvVar8;
  pointer ppVar9;
  size_type sVar10;
  undefined1 auVar11 [16];
  int local_a4;
  double local_98;
  double *local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  _Base_ptr local_80;
  double local_78;
  double mean_by_period;
  aal_rec_period *a;
  iterator iStack_60;
  int sidx;
  iterator iter;
  double total_mean_by_period;
  aal_rec_period *a_total;
  aal_rec *aa;
  double mean;
  _Self local_30;
  double local_28;
  double factor;
  double weighting;
  aalcalc *paStack_10;
  int period_no_local;
  aalcalc *this_local;
  
  factor = 1.0;
  weighting._4_4_ = period_no;
  paStack_10 = this;
  sVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
          size(&this->periodstoweighting_);
  auVar11._8_4_ = (int)(sVar4 >> 0x20);
  auVar11._0_8_ = sVar4;
  auVar11._12_4_ = 0x45300000;
  local_28 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0);
  if (0.0 < local_28) {
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::find
                   (&this->periodstoweighting_,(key_type *)((long)&weighting + 4));
    mean = (double)std::
                   map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   ::end(&this->periodstoweighting_);
    bVar3 = std::operator!=(&local_30,(_Self *)&mean);
    if (bVar3) {
      pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->periodstoweighting_,(key_type *)((long)&weighting + 4));
      factor = *pmVar5 * local_28;
    }
    else {
      factor = 0.0;
    }
  }
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->vec_sample_sum_loss_,0);
  dVar1 = *pvVar6;
  pvVar7 = std::vector<aal_rec,_std::allocator<aal_rec>_>::operator[]
                     (&this->vec_analytical_aal_,(long)this->current_summary_id_);
  pvVar7->type = 1;
  pvVar7->summary_id = this->current_summary_id_;
  pvVar7->mean = dVar1 * factor + pvVar7->mean;
  pvVar7->mean_squared = dVar1 * dVar1 * factor + pvVar7->mean_squared;
  this_00 = std::
            map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
            ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  pvVar8 = std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::operator[]
                     (this_00,(long)this->current_summary_id_);
  (pvVar8->super_aal_rec).type = 2;
  if (this->samplesize_ == 0) {
    local_a4 = 0;
  }
  else {
    local_a4 = this->current_summary_id_;
  }
  (pvVar8->super_aal_rec).summary_id = local_a4;
  iter._M_node = (_Base_ptr)0x0;
  iStack_60 = std::
              map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
              ::begin(&this->vec_sample_aal_);
  for (a._4_4_ = 1; a._4_4_ < this->samplesize_ + 1; a._4_4_ = a._4_4_ + 1) {
    while (ppVar9 = std::
                    _Rb_tree_iterator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>
                    ::operator->(&stack0xffffffffffffffa0), ppVar9->first != this->samplesize_) {
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>
               ::operator->(&stack0xffffffffffffffa0);
      mean_by_period =
           (double)std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>::operator[]
                             (&ppVar9->second,(long)this->current_summary_id_);
      local_78 = 0.0;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>
               ::operator->(&stack0xffffffffffffffa0);
      for (a._4_4_ = ppVar9->first; iVar2 = a._4_4_,
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>
                   ::operator->(&stack0xffffffffffffffa0),
          SBORROW4(iVar2,ppVar9->first * 2) != iVar2 + ppVar9->first * -2 < 0; a._4_4_ = a._4_4_ + 1
          ) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->vec_sample_sum_loss_,(long)a._4_4_);
        dVar1 = *pvVar6;
        *(undefined4 *)((long)mean_by_period + 4) = 2;
        *(int *)mean_by_period = this->current_summary_id_;
        local_78 = dVar1 * factor + local_78;
        *(double *)((long)mean_by_period + 8) =
             dVar1 * factor + *(double *)((long)mean_by_period + 8);
        iter._M_node = (_Base_ptr)(dVar1 * factor + iter._M_node);
        (pvVar8->super_aal_rec).mean = dVar1 * factor + (pvVar8->super_aal_rec).mean;
        *(double *)((long)mean_by_period + 0x10) =
             dVar1 * dVar1 * factor + *(double *)((long)mean_by_period + 0x10);
        (pvVar8->super_aal_rec).mean_squared =
             dVar1 * dVar1 * factor + (pvVar8->super_aal_rec).mean_squared;
        sVar10 = std::vector<int,_std::allocator<int>_>::size(&this->sidxtoensemble_);
        if (sVar10 != 0) {
          fillensemblerec(this,a._4_4_,dVar1,factor);
        }
      }
      *(double *)((long)mean_by_period + 0x18) =
           local_78 * local_78 + *(double *)((long)mean_by_period + 0x18);
      local_80 = (_Base_ptr)
                 std::
                 _Rb_tree_iterator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>
                 ::operator++(&stack0xffffffffffffffa0,0);
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->vec_sample_sum_loss_,(long)a._4_4_);
    dVar1 = *pvVar6;
    iter._M_node = (_Base_ptr)(dVar1 * factor + iter._M_node);
    (pvVar8->super_aal_rec).mean = dVar1 * factor + (pvVar8->super_aal_rec).mean;
    (pvVar8->super_aal_rec).mean_squared =
         dVar1 * dVar1 * factor + (pvVar8->super_aal_rec).mean_squared;
    sVar10 = std::vector<int,_std::allocator<int>_>::size(&this->sidxtoensemble_);
    if (sVar10 != 0) {
      fillensemblerec(this,a._4_4_,dVar1,factor);
    }
  }
  pvVar8->mean_period = (double)iter._M_node * (double)iter._M_node + pvVar8->mean_period;
  local_88._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->vec_sample_sum_loss_);
  local_90 = (double *)
             std::vector<double,_std::allocator<double>_>::end(&this->vec_sample_sum_loss_);
  local_98 = 0.0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (local_88,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_90,&local_98);
  return;
}

Assistant:

void aalcalc::do_calc_end(const int period_no) {

	// Get weighting
	double weighting = 1;
	double factor = (double)periodstoweighting_.size();
	if (factor > 0) {
		if (periodstoweighting_.find(period_no) != periodstoweighting_.end()) {
			weighting = periodstoweighting_[period_no] * factor;
		} else {
			weighting = 0;
		}
	}

	// There is always an analytical mean
	double mean = vec_sample_sum_loss_[0];
	aal_rec& aa = vec_analytical_aal_[current_summary_id_];
	aa.type = 1;
	aa.summary_id = current_summary_id_;
	aa.mean += mean * weighting;
	aa.mean_squared += mean * mean * weighting;

	aal_rec_period& a_total = vec_sample_aal_[samplesize_][current_summary_id_];
	a_total.type = 2;
	a_total.summary_id = samplesize_ != 0 ? current_summary_id_ : 0;
	double total_mean_by_period = 0;
	auto iter = vec_sample_aal_.begin();
	for (int sidx = 1; sidx < samplesize_ + 1; sidx++) {
		while (iter->first != samplesize_) {
			aal_rec_period& a = iter->second[current_summary_id_];
			double mean_by_period = 0;
			for (sidx = iter->first; sidx < (iter->first << 1); sidx++)
			{
				mean = vec_sample_sum_loss_[sidx];
				a.type = 2;
				a.summary_id = current_summary_id_;
				mean_by_period += mean * weighting;
				a.mean += mean * weighting;
				total_mean_by_period += mean * weighting;
				a_total.mean += mean * weighting;
				a.mean_squared += mean * mean * weighting;
				a_total.mean_squared += mean * mean * weighting;
				if (sidxtoensemble_.size() > 0)
					fillensemblerec(sidx, mean, weighting);
			}
			a.mean_period += mean_by_period * mean_by_period;
			iter++;
		}
		mean = vec_sample_sum_loss_[sidx];
		total_mean_by_period += mean * weighting;
		a_total.mean += mean * weighting;
		a_total.mean_squared += mean * mean * weighting;
		if (sidxtoensemble_.size() > 0)
			fillensemblerec(sidx, mean, weighting);
	}
	a_total.mean_period += total_mean_by_period * total_mean_by_period;

	std::fill(vec_sample_sum_loss_.begin(), vec_sample_sum_loss_.end(), 0.0);

}